

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds03_heap_erase.cpp
# Opt level: O1

void __thiscall
CP::priority_queue<int,_std::less<int>_>::erase(priority_queue<int,_std::less<int>_> *this,int *v)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  ulong uVar4;
  size_t idx;
  
  uVar4 = this->mSize;
  if (uVar4 != 0) {
    idx = 0;
    do {
      piVar2 = this->mData;
      if (piVar2[idx] == *v) {
        this->mSize = uVar4 - 1;
        piVar2[idx] = piVar2[uVar4 - 1];
      }
      iVar1 = piVar2[idx];
      sVar3 = idx;
      while (sVar3 != 0) {
        uVar4 = sVar3 - 1 >> 1;
        if (iVar1 < piVar2[uVar4]) goto LAB_001014b5;
        piVar2[sVar3] = piVar2[uVar4];
        sVar3 = uVar4;
      }
      sVar3 = 0;
LAB_001014b5:
      piVar2[sVar3] = iVar1;
      fixDown(this,idx);
      idx = idx + 1;
      uVar4 = this->mSize;
    } while (idx < uVar4);
  }
  return;
}

Assistant:

void erase(const T &v) {
        for (int i = 0; i < mSize; ++i) {
            if (mData[i] == v)
                mData[i] = mData[(mSize--) - 1];
            fixUp(i);
            fixDown(i);
        }
    }